

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

int64_t jsonnet::internal::safeDoubleToInt64(double value,LocationRange *loc)

{
  StaticError *pSVar1;
  string local_40;
  
  if ((!NAN(value)) && (ABS(value) != INFINITY)) {
    if (ABS(value) <= 9007199254740992.0) {
      return (long)value;
    }
    pSVar1 = (StaticError *)__cxa_allocate_exception(0x60);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"numeric value outside safe integer range for bitwise operation."
               ,"");
    StaticError::StaticError(pSVar1,loc,&local_40);
    __cxa_throw(pSVar1,&StaticError::typeinfo,StaticError::~StaticError);
  }
  pSVar1 = (StaticError *)__cxa_allocate_exception(0x60);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"numeric value is not finite","");
  StaticError::StaticError(pSVar1,loc,&local_40);
  __cxa_throw(pSVar1,&StaticError::typeinfo,StaticError::~StaticError);
}

Assistant:

inline int64_t safeDoubleToInt64(double value, const internal::LocationRange& loc) {
    if (std::isnan(value) || std::isinf(value)) {
        throw internal::StaticError(loc, "numeric value is not finite");
    }

    // Constants for safe double-to-int conversion
    // Jsonnet uses IEEE 754 doubles, which precisely represent integers in the range [-2^53, 2^53].
    constexpr int64_t DOUBLE_MAX_SAFE_INTEGER = 1LL << 53;
    constexpr int64_t DOUBLE_MIN_SAFE_INTEGER = -(1LL << 53);

    // Check if the value is within the safe integer range
    if (value < DOUBLE_MIN_SAFE_INTEGER || value > DOUBLE_MAX_SAFE_INTEGER) {
        throw internal::StaticError(loc, "numeric value outside safe integer range for bitwise operation.");
    }
    return static_cast<int64_t>(value);
}